

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O2

void __thiscall
QUrlModel::setUrl(QUrlModel *this,QModelIndex *index,QUrl *url,QModelIndex *dirIndex)

{
  undefined8 uVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  char16_t *tmp;
  Mode MVar8;
  long in_FS_OFFSET;
  double dVar9;
  QIconPrivate *local_c0;
  QFileInfo local_b8 [8];
  QIcon newIcon;
  QIcon oldIcon;
  undefined8 uStack_90;
  undefined8 uStack_88;
  QArrayDataPointer<char16_t> local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ::QVariant::QVariant((QVariant *)&local_58,url);
  (**(code **)(*(long *)this + 0x98))(this,index,&local_58,0x101);
  ::QVariant::~QVariant((QVariant *)&local_58);
  QUrl::path(&local_58,url,0x7f00000);
  uVar1 = local_58._16_8_;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  if ((undefined1 *)uVar1 == (undefined1 *)0x0) {
    QFileSystemModel::myComputer((int)&local_58);
    (**(code **)(*(long *)this + 0x98))(this,index,&local_58,2);
    ::QVariant::~QVariant((QVariant *)&local_58);
    QFileSystemModel::myComputer((int)&local_58);
    (**(code **)(*(long *)this + 0x98))(this,index,&local_58,1);
    ::QVariant::~QVariant((QVariant *)&local_58);
  }
  else {
    local_78.size = 0;
    local_78.d = (Data *)0x0;
    local_78.ptr = (char16_t *)0x0;
    if (this->showFullPath == true) {
      QModelIndex::data((QVariant *)&local_58,dirIndex,0x101);
      ::QVariant::toString();
      QDir::toNativeSeparators((QString *)&oldIcon);
      local_c0 = oldIcon.d;
      local_78.d = (Data *)oldIcon.d;
      oldIcon.d = (QIconPrivate *)0x0;
      local_78.ptr = (char16_t *)uStack_90;
      local_78.size = uStack_88;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&oldIcon);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&newIcon);
    }
    else {
      QModelIndex::data((QVariant *)&local_58,dirIndex,0);
      ::QVariant::toString();
      local_c0 = oldIcon.d;
      local_78.d = (Data *)oldIcon.d;
      oldIcon.d = (QIconPrivate *)0x0;
      local_78.ptr = (char16_t *)uStack_90;
      local_78.size = uStack_88;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&oldIcon);
    }
    ::QVariant::~QVariant((QVariant *)&local_58);
    newIcon.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::data((QVariant *)&local_58,dirIndex,1);
    qvariant_cast<QIcon>((QVariant *)&newIcon);
    ::QVariant::~QVariant((QVariant *)&local_58);
    bVar2 = QModelIndex::isValid(dirIndex);
    if (bVar2) {
      bVar2 = true;
    }
    else {
      plVar5 = (long *)QFileSystemModel::iconProvider();
      if (plVar5 != (long *)0x0) {
        (**(code **)(*plVar5 + 0x10))(&local_58,plVar5,5);
        QIcon::operator=(&newIcon,(QIcon *)&local_58.shared);
        QIcon::~QIcon((QIcon *)&local_58.shared);
      }
      QUrl::toLocalFile();
      QFileInfo::QFileInfo(local_b8,(QString *)&oldIcon);
      QFileInfo::fileName();
      local_78.d = (Data *)local_58.shared;
      local_58.shared = (PrivateShared *)local_c0;
      local_78.ptr = (char16_t *)local_58._8_8_;
      local_58._8_8_ = uStack_90;
      local_78.size = local_58._16_8_;
      local_58._16_8_ = uStack_88;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
      QFileInfo::~QFileInfo(local_b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&oldIcon);
      bVar2 = QListSpecialMethodsBase<QUrl>::contains<QUrl>
                        ((QListSpecialMethodsBase<QUrl> *)&this->invalidUrls,url);
      if (!bVar2) {
        QList<QUrl>::emplaceBack<QUrl_const&>(&this->invalidUrls,url);
      }
      bVar2 = false;
    }
    ::QVariant::QVariant((QVariant *)&local_58,bVar2);
    (**(code **)(*(long *)this + 0x98))(this,index,&local_58,0x102);
    ::QVariant::~QVariant((QVariant *)&local_58);
    cVar3 = QIcon::isNull();
    if (cVar3 == '\0') {
      local_58.shared = (PrivateShared *)0x2000000020;
      iVar4 = QIcon::actualSize((QSize *)&newIcon,(Mode)&local_58,On);
      if (iVar4 < 0x20) {
        lVar6 = *(long *)(*(long *)&this->field_0x8 + 0x10);
        if ((lVar6 == 0) || ((*(byte *)(*(long *)(lVar6 + 8) + 0x30) & 1) == 0)) {
          dVar9 = (double)QGuiApplication::devicePixelRatio();
        }
        else {
          dVar9 = (double)QPaintDevice::devicePixelRatio();
        }
        local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        oldIcon.d = (QIconPrivate *)0x2000000020;
        QIcon::pixmap((QSize *)&local_58.shared,dVar9,(Mode)&newIcon,(State)&oldIcon);
        oldIcon.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
        MVar8 = (Mode)(QPixmap *)&oldIcon;
        QPixmap::scaledToWidth(MVar8,(TransformationMode)&local_58);
        QIcon::addPixmap((QPixmap *)&newIcon,MVar8,On);
        QPixmap::~QPixmap((QPixmap *)&oldIcon);
        QPixmap::~QPixmap((QPixmap *)local_58.data);
      }
    }
    QModelIndex::data((QVariant *)&local_58,index,0);
    ::QVariant::toString();
    bVar2 = ::operator!=((QString *)&oldIcon,(QString *)&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&oldIcon);
    ::QVariant::~QVariant((QVariant *)&local_58);
    if (bVar2) {
      ::QVariant::QVariant((QVariant *)&local_58,(QString *)&local_78);
      (**(code **)(*(long *)this + 0x98))(this,index,&local_58,2);
      ::QVariant::~QVariant((QVariant *)&local_58);
    }
    oldIcon.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::data((QVariant *)&local_58,index,1);
    qvariant_cast<QIcon>((QVariant *)&oldIcon);
    ::QVariant::~QVariant((QVariant *)&local_58);
    lVar6 = QIcon::cacheKey();
    lVar7 = QIcon::cacheKey();
    if (lVar6 != lVar7) {
      QIcon::operator_cast_to_QVariant((QVariant *)&local_58,&newIcon);
      (**(code **)(*(long *)this + 0x98))(this,index,&local_58,1);
      ::QVariant::~QVariant((QVariant *)&local_58);
    }
    QIcon::~QIcon(&oldIcon);
    QIcon::~QIcon(&newIcon);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUrlModel::setUrl(const QModelIndex &index, const QUrl &url, const QModelIndex &dirIndex)
{
    setData(index, url, UrlRole);
    if (url.path().isEmpty()) {
        setData(index, fileSystemModel->myComputer());
        setData(index, fileSystemModel->myComputer(Qt::DecorationRole), Qt::DecorationRole);
    } else {
        QString newName;
        if (showFullPath) {
            //On windows the popup display the "C:\", convert to nativeSeparators
            newName = QDir::toNativeSeparators(dirIndex.data(QFileSystemModel::FilePathRole).toString());
        } else {
            newName = dirIndex.data().toString();
        }

        QIcon newIcon = qvariant_cast<QIcon>(dirIndex.data(Qt::DecorationRole));
        if (!dirIndex.isValid()) {
            const QAbstractFileIconProvider *provider = fileSystemModel->iconProvider();
            if (provider)
                newIcon = provider->icon(QAbstractFileIconProvider::Folder);
            newName = QFileInfo(url.toLocalFile()).fileName();
            if (!invalidUrls.contains(url))
                invalidUrls.append(url);
            //The bookmark is invalid then we set to false the EnabledRole
            setData(index, false, EnabledRole);
        } else {
            //The bookmark is valid then we set to true the EnabledRole
            setData(index, true, EnabledRole);
        }

        // newIcon could be null if fileSystemModel->iconProvider() returns null
        if (!newIcon.isNull()) {
        // Make sure that we have at least 32x32 images
            const QSize size = newIcon.actualSize(QSize(32,32));
            if (size.width() < 32) {
                const auto widget = qobject_cast<QWidget *>(parent());
                const auto dpr = widget ? widget->devicePixelRatio() : qApp->devicePixelRatio();
                const auto smallPixmap = newIcon.pixmap(QSize(32, 32), dpr);
                const auto newPixmap = smallPixmap.scaledToWidth(32 * dpr, Qt::SmoothTransformation);
                newIcon.addPixmap(newPixmap);
            }
        }

        if (index.data().toString() != newName)
            setData(index, newName);
        QIcon oldIcon = qvariant_cast<QIcon>(index.data(Qt::DecorationRole));
        if (oldIcon.cacheKey() != newIcon.cacheKey())
            setData(index, newIcon, Qt::DecorationRole);
    }
}